

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayMethods.cpp
# Opt level: O3

Type * __thiscall
slang::ast::builtins::QueuePopMethod::checkArguments
          (QueuePopMethod *this,ASTContext *context,Args *args,SourceRange range,Expression *param_4
          )

{
  Compilation *pCVar1;
  bool bVar2;
  Type *pTVar3;
  
  pCVar1 = ((context->scope).ptr)->compilation;
  bVar2 = SystemSubroutine::checkArgCount(&this->super_SystemSubroutine,context,true,args,range,0,0)
  ;
  if (bVar2) {
    bVar2 = SystemSubroutine::registerLValue(*args->_M_ptr,context);
    if (bVar2) {
      pTVar3 = Type::getArrayElementType(((*args->_M_ptr)->type).ptr);
      return pTVar3;
    }
  }
  return pCVar1->errorType;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, true, args, range, 0, 0))
            return comp.getErrorType();

        if (!registerLValue(*args[0], context))
            return comp.getErrorType();

        return *args[0]->type->getArrayElementType();
    }